

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

bool __thiscall hwnet::util::TimerMgr::insert(TimerMgr *this,Ptr *e)

{
  Timer *e_00;
  ulong uVar1;
  size_t sVar2;
  pointer ppTVar3;
  bool bVar4;
  size_t sVar5;
  size_t offset;
  Timer *local_20;
  
  e_00 = (e->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (e_00->mMgr == (TimerMgr *)0x0 || e_00->mMgr == this) {
    uVar1 = e_00->mIndex;
    if (uVar1 == 0) {
      e_00->mMgr = this;
      sVar2 = this->elements_size;
      sVar5 = sVar2 + 1;
      e_00->mIndex = sVar5;
      ppTVar3 = (this->elements).
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (sVar2 == (long)(this->elements).
                         super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) {
        local_20 = e_00;
        std::vector<hwnet::util::Timer*,std::allocator<hwnet::util::Timer*>>::
        emplace_back<hwnet::util::Timer*>
                  ((vector<hwnet::util::Timer*,std::allocator<hwnet::util::Timer*>> *)
                   &this->elements,&local_20);
        sVar5 = this->elements_size + 1;
      }
      else {
        ppTVar3[sVar2] = e_00;
      }
      this->elements_size = sVar5;
      up(this,((e->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              mIndex);
      std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((e->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>,
                 &e->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      if ((this->elements_size < uVar1) ||
         ((this->elements).
          super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1 - 1] != e_00)) goto LAB_0011b49a;
      change(this,e_00);
    }
    bVar4 = true;
  }
  else {
LAB_0011b49a:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool insert(Timer::Ptr &e) {

		if(e->mMgr != nullptr && e->mMgr != this) {
			return false;
		}

		if(e->mIndex > 0) {
			if(e->mIndex > this->elements_size) {
				return false;
			}
			auto offsetIdx = getOffset(e->mIndex);
			if(this->elements[offsetIdx] != e.get()) {
				return false;
			}
			change(e.get());
			return true;
		} else {
			e->mMgr = this;
			e->mIndex = this->elements_size+1;
			if(this->elements_size == this->elements.size()) {
				this->elements.push_back(e.get());
			} else {
				auto offset = getNextFreeOffset();
				this->elements[offset] = e.get();
			}
			++this->elements_size;
			this->up(e->mIndex);
			e->selfPtr = e;
			return true;
		}
	}